

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_locate_nearest(REF_INTERP ref_interp)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL radius;
  REF_DBL center [3];
  REF_INT local_b8 [2];
  REF_INT nodes [27];
  REF_INT cell;
  REF_SEARCH ref_search;
  REF_NODE pRStack_38;
  REF_BOOL increase_fuzz;
  REF_NODE from_node;
  REF_CELL from_tri;
  REF_GRID from_grid;
  REF_MPI ref_mpi;
  REF_INTERP ref_interp_local;
  
  from_grid = (REF_GRID)ref_interp->ref_mpi;
  from_tri = (REF_CELL)ref_interp->from_grid;
  from_node = (REF_NODE)ref_interp->from_tri;
  pRStack_38 = ((REF_GRID)from_tri)->node;
  ref_mpi = (REF_MPI)ref_interp;
  if ((ref_interp->instrument == 0) ||
     (uVar1 = ref_mpi_stopwatch_start((REF_MPI)from_grid), uVar1 == 0)) {
    uVar1 = ref_interp_seed_tree((REF_INTERP)ref_mpi);
    if (uVar1 == 0) {
      if ((ref_mpi->timing == 0) ||
         (uVar1 = ref_mpi_stopwatch_stop((REF_MPI)from_grid,"seed tree"), uVar1 == 0)) {
        uVar1 = ref_interp_process_agents((REF_INTERP)ref_mpi);
        if (uVar1 == 0) {
          if ((ref_mpi->timing == 0) ||
             (uVar1 = ref_mpi_stopwatch_stop((REF_MPI)from_grid,"drain"), uVar1 == 0)) {
            ref_search._4_4_ = 0;
            uVar1 = ref_interp_tree((REF_INTERP)ref_mpi,(REF_BOOL *)((long)&ref_search + 4));
            if (uVar1 == 0) {
              if ((ref_mpi->timing == 0) ||
                 (uVar1 = ref_mpi_stopwatch_stop((REF_MPI)from_grid,"tree"), uVar1 == 0)) {
                if (ref_search._4_4_ != 0) {
                  uVar1 = ref_search_create((REF_SEARCH *)(nodes + 0x1a),
                                            *(REF_INT *)&from_node->part);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x73b,"ref_interp_locate_nearest",(ulong)uVar1,"create search");
                    return uVar1;
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < *(int *)((long)&from_node->part + 4);
                      nodes[0x19] = nodes[0x19] + 1) {
                    RVar2 = ref_cell_nodes((REF_CELL)from_node,nodes[0x19],local_b8);
                    if (RVar2 == 0) {
                      uVar1 = ref_node_bounding_sphere
                                        (pRStack_38,local_b8,3,&radius,
                                         (REF_DBL *)&ref_private_macro_code_rss_1);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x73d,"ref_interp_locate_nearest",(ulong)uVar1,"b");
                        return uVar1;
                      }
                      uVar1 = ref_search_insert(stack0xffffffffffffffb8,nodes[0x19],&radius,
                                                *(double *)&ref_mpi[2].timing *
                                                _ref_private_macro_code_rss_1);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x740,"ref_interp_locate_nearest",(ulong)uVar1,"ins");
                        return uVar1;
                      }
                    }
                  }
                  uVar1 = ref_interp_nearest_tet_via_tri_in_tree
                                    ((REF_INTERP)ref_mpi,stack0xffffffffffffffb8);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x743,"ref_interp_locate_nearest",(ulong)uVar1,"near tri");
                    return uVar1;
                  }
                  uVar1 = ref_search_free(stack0xffffffffffffffb8);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x744,"ref_interp_locate_nearest",(ulong)uVar1,"free search");
                    return uVar1;
                  }
                }
                ref_interp_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x738,"ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
                ref_interp_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x736,"ref_interp_locate_nearest",(ulong)uVar1,"tree");
              ref_interp_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x733,"ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
            ref_interp_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x731,"ref_interp_locate_nearest",(ulong)uVar1,"drain");
          ref_interp_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x72f,"ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
        ref_interp_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x72d,"ref_interp_locate_nearest",(ulong)uVar1,"seed tree nodes");
      ref_interp_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x72b,
           "ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
    ref_interp_local._4_4_ = uVar1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_nearest(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);

  REF_CELL from_tri = ref_interp_from_tri(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);

  REF_BOOL increase_fuzz;
  REF_SEARCH ref_search;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_seed_tree(ref_interp), "seed tree nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "seed tree"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");

  if (increase_fuzz) {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tri)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tri, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 3, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
    RSS(ref_interp_nearest_tet_via_tri_in_tree(ref_interp, ref_search),
        "near tri");
    RSS(ref_search_free(ref_search), "free search");
  }

  return REF_SUCCESS;
}